

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifsub(bifcxdef *ctx,int argc)

{
  long lVar1;
  char *str;
  runcxdef *ctx_00;
  long in_RDI;
  int len;
  int outlen;
  int asklen;
  int ofs;
  uchar *p;
  int in_stack_ffffffffffffffbc;
  runcxdef *in_stack_ffffffffffffffc0;
  runcxdef *ctx_01;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) != '\x03') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  ctx_01 = *(runcxdef **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  osrp2(ctx_01);
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) != '\x01') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  str = *(char **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  if ((int)str < 1) {
    *(char **)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x18) = "substr";
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 1;
    runsign(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) == '\x01') {
    ctx_00 = *(runcxdef **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    if (-1 < (int)ctx_00) {
      runpstr(ctx_01,str,(int)((ulong)ctx_00 >> 0x20),(int)ctx_00);
      return;
    }
    *(char **)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x18) = "substr";
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 1;
    runsign(ctx_00,in_stack_ffffffffffffffbc);
  }
  *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
  runsign(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
}

Assistant:

void bifsub(bifcxdef *ctx, int argc)
{
    uchar   *p;
    int      ofs;
    int      asklen;
    int      outlen;
    int      len;

    bifcntargs(ctx, 3, argc);

    /* get the string argument */
    bifchkarg(ctx, DAT_SSTRING);
    p = runpopstr(ctx->bifcxrun);
    len = osrp2(p) - 2;
    p += 2;
    
    /* get the offset argument */
    bifchkarg(ctx, DAT_NUMBER);
    ofs = runpopnum(ctx->bifcxrun);
    if (ofs < 1) runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "substr");
    
    /* get the length argument */
    bifchkarg(ctx, DAT_NUMBER);
    asklen = runpopnum(ctx->bifcxrun);
    if (asklen < 0) runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "substr");

    --ofs;          /* convert offset to a zero bias (user provided 1-bias) */
    p += ofs;                           /* advance string pointer by offset */

    if (ofs >= len)
        outlen = 0;                         /* offset is past end of string */
    else if (asklen > len - ofs)
        outlen = len - ofs;                      /* just use rest of string */
    else
        outlen = asklen;                /* requested length can be provided */
    
    runpstr(ctx->bifcxrun, (char *)p, outlen, 3);
}